

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Flt_t * Gia_SimQualityImpact(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vRareCounts)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  int *piVar6;
  Vec_Flt_t *pVVar7;
  float *__s;
  Vec_Wrd_t *__ptr;
  word *pwVar8;
  Vec_Wrd_t *__ptr_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int w;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  float fVar17;
  
  pVVar4 = p->vCis;
  iVar2 = pVVar4->nSize;
  pVVar7 = (Vec_Flt_t *)malloc(0x10);
  iVar9 = iVar2;
  if (iVar2 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (float *)0x0;
  }
  else {
    __s = (float *)malloc((long)iVar9 << 2);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar2;
  memset(__s,0,(long)iVar2 * 4);
  uVar10 = pVVar4->nSize + 1;
  uVar10 = (((int)uVar10 >> 6) + 1) - (uint)((uVar10 & 0x3f) == 0);
  iVar15 = pVVar4->nSize * uVar10;
  __ptr = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar9 = iVar15;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar9;
  if (iVar9 == 0) {
    pwVar8 = (word *)0x0;
  }
  else {
    pwVar8 = (word *)malloc((long)iVar9 << 3);
  }
  __ptr->pArray = pwVar8;
  __ptr->nSize = iVar15;
  memset(pwVar8,0,(long)iVar15 * 8);
  uVar3 = vPat->nSize;
  if (uVar3 != pVVar4->nSize) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x71f,"Vec_Flt_t *Gia_SimQualityImpact(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (0 < (int)uVar3) {
    lVar11 = 0;
    uVar14 = 1;
    do {
      if ((lVar11 < 0) || (iVar15 <= lVar11)) goto LAB_007bf1fe;
      if ((0 < (int)uVar10) && (vPat->pArray[uVar14 - 1] != 0)) {
        memset(pwVar8 + lVar11,0xff,(ulong)uVar10 * 8);
      }
      pwVar8[(uVar14 >> 6) + lVar11] = pwVar8[(uVar14 >> 6) + lVar11] ^ 1L << ((byte)uVar14 & 0x3f);
      lVar11 = lVar11 + (int)uVar10;
      bVar16 = uVar14 != uVar3;
      uVar14 = uVar14 + 1;
    } while (bVar16);
  }
  pVVar5 = p->vSimsPi;
  p->vSimsPi = __ptr;
  __ptr_00 = Gia_ManSimPatSim(p);
  p->vSimsPi = pVVar5;
  iVar9 = vRareCounts->nSize;
  if (1 < iVar9) {
    piVar6 = vRareCounts->pArray;
    lVar11 = 0;
    do {
      uVar3 = piVar6[lVar11];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar12 = (uVar3 >> 1) * uVar10;
      if (((int)uVar12 < 0) || (__ptr_00->nSize <= (int)uVar12)) {
LAB_007bf1fe:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      iVar15 = piVar6[lVar11 + 1];
      pwVar8 = __ptr_00->pArray + uVar12;
      uVar12 = (uint)*pwVar8 & 1;
      if ((0 < (int)uVar10) && (uVar12 != 0)) {
        uVar14 = 0;
        do {
          pwVar8[uVar14] = ~pwVar8[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
      }
      uVar14 = (ulong)p->vCis->nSize;
      if (0 < (long)uVar14) {
        fVar17 = 1.0 / (float)(iVar15 + 1);
        if (uVar12 == (uVar3 & 1)) {
          fVar17 = -fVar17;
        }
        uVar13 = 0;
        do {
          uVar1 = uVar13 + 1;
          if ((pwVar8[uVar1 >> 6 & 0x3ffffff] >> (uVar1 & 0x3f) & 1) != 0) {
            if ((long)iVar2 <= (long)uVar13) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                            ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
            }
            __s[uVar13] = __s[uVar13] + fVar17;
          }
          uVar13 = uVar1;
        } while (uVar14 != uVar1);
      }
      lVar11 = lVar11 + 2;
    } while ((int)((uint)lVar11 | 1) < iVar9);
  }
  if (__ptr_00->pArray != (word *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (word *)0x0;
  }
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    free(__ptr_00);
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  free(__ptr);
  return pVVar7;
}

Assistant:

Vec_Flt_t * Gia_SimQualityImpact( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vRareCounts )
{
    Vec_Flt_t * vQuoIncs = Vec_FltStart( Gia_ManCiNum(p) );
    int nWordsNew = Abc_Bit6WordNum( 1+Gia_ManCiNum(p) );
    Vec_Wrd_t * vSimsPiNew = Vec_WrdStart( Gia_ManCiNum(p) * nWordsNew );
    Vec_Wrd_t * vTemp, * vSims;
    int i, k, Value, RareLit, RareCount;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        word * pSim = Vec_WrdEntryP( vSimsPiNew, i*nWordsNew );
        if ( Value )
            Abc_TtFill( pSim, nWordsNew );
        Abc_TtXorBit( pSim, i+1 );
    }
    vTemp = p->vSimsPi;
    p->vSimsPi = vSimsPiNew;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWordsNew );
        int OrigVal = pSim[0] & 1;
        if ( OrigVal )
            Abc_TtNot( pSim, nWordsNew );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            if ( Abc_TtGetBit(pSim, k+1) ) // value changed
                Vec_FltAddToEntry( vQuoIncs, k, OrigVal != RareVal ? Incrm : -Incrm );
    }
    Vec_WrdFree( vSims );
    Vec_WrdFree( vSimsPiNew );
    return vQuoIncs;
}